

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

void duckdb::CreateSortKeyInternal
               (vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
                *sort_key_data,vector<duckdb::OrderModifiers,_true> *modifiers,Vector *result,
               idx_t row_count)

{
  PhysicalType type;
  LogicalTypeId LVar1;
  pointer puVar2;
  SortKeyChunk chunk;
  undefined1 auVar3 [32];
  bool bVar4;
  type pSVar5;
  idx_t iVar6;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_> uVar7;
  data_ptr_t pdVar8;
  const_reference pvVar9;
  reference this;
  InternalException *pIVar10;
  data_ptr_t extraout_RDX;
  idx_t c;
  ulong uVar11;
  vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
  *__range1;
  unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
  *vector_data;
  pointer this_00;
  data_ptr_t pdVar12;
  string_t *this_01;
  anon_struct_16_3_d7536bce_for_pointer aVar13;
  string local_b8;
  unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>,_true> data_pointers;
  SortKeyLengthInfo key_lengths;
  SortKeyConstructInfo info;
  unsafe_vector<idx_t> offsets;
  
  SortKeyLengthInfo::SortKeyLengthInfo(&key_lengths,row_count);
  puVar2 = (sort_key_data->
           super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
           ).
           super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (sort_key_data->
                 super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 ).
                 super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar2; this_00 = this_00 + 1
      ) {
    pSVar5 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
             ::operator*(this_00);
    local_b8._M_string_length = pSVar5->size;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8.field_2._M_local_buf[8] = '\0';
    type = (pSVar5->vec->type).physical_type_;
    bVar4 = TypeIsConstantSize(type);
    if (bVar4) {
      key_lengths.constant_length = key_lengths.constant_length + 1;
      iVar6 = GetTypeIdSize(type);
      key_lengths.constant_length = key_lengths.constant_length + iVar6;
    }
    else {
      chunk._25_7_ = local_b8.field_2._9_7_;
      chunk.has_result_index = (bool)local_b8.field_2._M_local_buf[8];
      chunk.end = local_b8._M_string_length;
      chunk.start = (idx_t)local_b8._M_dataplus._M_p;
      chunk.result_index = local_b8.field_2._M_allocated_capacity;
      GetSortKeyLengthRecursive(pSVar5,chunk,&key_lengths);
    }
  }
  uVar7._M_t.super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
  super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char_*,_std::default_delete<unsigned_char_*[]>,_true,_true>)
       operator_new__(-(ulong)(row_count >> 0x3d != 0) | row_count * 8);
  LVar1 = (result->type).id_;
  data_pointers.super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>._M_t.
  super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
  super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl =
       (unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>)
       (unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>)
       uVar7._M_t.super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>.
       _M_t.super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
       super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl;
  if (LVar1 == BIGINT) {
    pdVar8 = result->data;
    for (iVar6 = 0; row_count != iVar6; iVar6 = iVar6 + 1) {
      pdVar8[0] = '\0';
      pdVar8[1] = '\0';
      pdVar8[2] = '\0';
      pdVar8[3] = '\0';
      pdVar8[4] = '\0';
      pdVar8[5] = '\0';
      pdVar8[6] = '\0';
      pdVar8[7] = '\0';
      *(data_ptr_t *)
       ((long)uVar7._M_t.
              super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
              super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl + iVar6 * 8) = pdVar8;
      pdVar8 = pdVar8 + 8;
    }
  }
  else {
    if (LVar1 != BLOB) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_b8,"Unsupported key type for CreateSortKey",(allocator *)&info);
      InternalException::InternalException(pIVar10,&local_b8);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pdVar12 = result->data + 4;
    pdVar8 = extraout_RDX;
    for (iVar6 = 0; row_count != iVar6; iVar6 = iVar6 + 1) {
      aVar13 = (anon_struct_16_3_d7536bce_for_pointer)
               StringVector::EmptyString
                         ((StringVector *)result,
                          (Vector *)
                          (key_lengths.constant_length +
                          key_lengths.variable_lengths.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar6]),(idx_t)pdVar8);
      ((anon_union_16_2_67f50693_for_value *)(pdVar12 + -4))->pointer = aVar13;
      pdVar8 = (data_ptr_t)aVar13.ptr;
      if (aVar13.length < 0xd) {
        pdVar8 = pdVar12;
      }
      *(data_ptr_t *)
       ((long)uVar7._M_t.
              super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
              super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
              super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl + iVar6 * 8) = pdVar8;
      pdVar12 = pdVar12 + 0x10;
    }
  }
  offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  offsets.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_b8._M_dataplus._M_p = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&offsets,row_count,
             (value_type_conflict2 *)&local_b8);
  for (uVar11 = 0;
      uVar11 < (ulong)((long)(sort_key_data->
                             super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(sort_key_data->
                             super_vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                             ).
                             super__Vector_base<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); uVar11 = uVar11 + 1) {
    pvVar9 = vector<duckdb::OrderModifiers,_true>::get<true>(modifiers,uVar11);
    info.modifiers = *pvVar9;
    info.result_data =
         (data_ptr_t *)
         data_pointers.super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>.
         _M_t.super___uniq_ptr_impl<unsigned_char_*,_std::default_delete<unsigned_char_*[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_**,_std::default_delete<unsigned_char_*[]>_>.
         super__Head_base<0UL,_unsigned_char_**,_false>._M_head_impl;
    info.flip_bytes = info.modifiers.order_type == DESCENDING;
    info.offsets = &offsets;
    this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
           ::get<true>(sort_key_data,uVar11);
    pSVar5 = unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
             ::operator*(this);
    local_b8._M_string_length = pSVar5->size;
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8.field_2._M_local_buf[8] = '\0';
    auVar3._8_8_ = local_b8.field_2._M_allocated_capacity;
    auVar3._0_8_ = local_b8._M_string_length;
    auVar3._16_8_ = (ulong)(uint7)local_b8.field_2._9_7_ << 8;
    auVar3._24_8_ = 0;
    ConstructSortKeyRecursive(pSVar5,(SortKeyChunk)(auVar3 << 0x40),&info);
  }
  LVar1 = (result->type).id_;
  if (LVar1 == BIGINT) {
    pdVar8 = result->data;
    for (iVar6 = 0; row_count != iVar6; iVar6 = iVar6 + 1) {
      uVar11 = *(ulong *)(pdVar8 + iVar6 * 8);
      *(ulong *)(pdVar8 + iVar6 * 8) =
           uVar11 >> 0x38 | (uVar11 & 0xff000000000000) >> 0x28 | (uVar11 & 0xff0000000000) >> 0x18
           | (uVar11 & 0xff00000000) >> 8 | (uVar11 & 0xff000000) << 8 | (uVar11 & 0xff0000) << 0x18
           | (uVar11 & 0xff00) << 0x28 | uVar11 << 0x38;
    }
  }
  else {
    if (LVar1 != BLOB) {
      pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_b8,"Unsupported key type for CreateSortKey",(allocator *)&info);
      InternalException::InternalException(pIVar10,&local_b8);
      __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (string_t *)result->data;
    while (bVar4 = row_count != 0, row_count = row_count - 1, bVar4) {
      string_t::Finalize(this_01);
      this_01 = this_01 + 1;
    }
  }
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&offsets);
  ::std::unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>::~unique_ptr
            (&data_pointers.
              super_unique_ptr<unsigned_char_*[],_std::default_delete<unsigned_char_*[]>_>);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
             &key_lengths.variable_lengths);
  return;
}

Assistant:

static void CreateSortKeyInternal(vector<unique_ptr<SortKeyVectorData>> &sort_key_data,
                                  const vector<OrderModifiers> &modifiers, Vector &result, idx_t row_count) {
	// two phases
	// a) get the length of the final sorted key
	// b) allocate the sorted key and construct
	// we do all of this in a vectorized manner
	SortKeyLengthInfo key_lengths(row_count);
	for (auto &vector_data : sort_key_data) {
		GetSortKeyLength(*vector_data, key_lengths);
	}
	// allocate the empty sort keys
	auto data_pointers = unique_ptr<data_ptr_t[]>(new data_ptr_t[row_count]);
	PrepareSortData(result, row_count, key_lengths, data_pointers.get());

	unsafe_vector<idx_t> offsets;
	offsets.resize(row_count, 0);
	// now construct the sort keys
	for (idx_t c = 0; c < sort_key_data.size(); c++) {
		SortKeyConstructInfo info(modifiers[c], offsets, data_pointers.get());
		ConstructSortKey(*sort_key_data[c], info);
	}
	FinalizeSortData(result, row_count);
}